

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLTypeConversions.cpp
# Opt level: O0

void __thiscall
Diligent::anon_unknown_1::FormatToGLInternalTexFormatMap::FormatToGLInternalTexFormatMap
          (FormatToGLInternalTexFormatMap *this)

{
  reference pvVar1;
  FormatToGLInternalTexFormatMap *this_local;
  
  memset(this,0,0x1a8);
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0);
  *pvVar1 = 0;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,1);
  *pvVar1 = 0x8814;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,2);
  *pvVar1 = 0x8814;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,3);
  *pvVar1 = 0x8d70;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,4);
  *pvVar1 = 0x8d82;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,5);
  *pvVar1 = 0x8815;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,6);
  *pvVar1 = 0x8815;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,7);
  *pvVar1 = 0x8d71;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,8);
  *pvVar1 = 0x8d83;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,9);
  *pvVar1 = 0x881a;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,10);
  *pvVar1 = 0x881a;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0xb);
  *pvVar1 = 0x805b;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0xc);
  *pvVar1 = 0x8d76;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0xd);
  *pvVar1 = 0x8f9b;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0xe);
  *pvVar1 = 0x8d88;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0xf);
  *pvVar1 = 0x8230;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x10);
  *pvVar1 = 0x8230;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x11);
  *pvVar1 = 0x823c;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x12);
  *pvVar1 = 0x823b;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x13);
  *pvVar1 = 0x8cad;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x14);
  *pvVar1 = 0x8cad;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x15);
  *pvVar1 = 0x8cad;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x16);
  *pvVar1 = 0;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x17);
  *pvVar1 = 0x8059;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x18);
  *pvVar1 = 0x8059;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x19);
  *pvVar1 = 0x906f;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x1a);
  *pvVar1 = 0x8c3a;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x1b);
  *pvVar1 = 0x8058;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x1c);
  *pvVar1 = 0x8058;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x1d);
  *pvVar1 = 0x8c43;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x1e);
  *pvVar1 = 0x8d7c;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x1f);
  *pvVar1 = 0x8f97;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x20);
  *pvVar1 = 0x8d8e;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x21);
  *pvVar1 = 0x822f;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x22);
  *pvVar1 = 0x822f;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x23);
  *pvVar1 = 0x822c;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x24);
  *pvVar1 = 0x823a;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x25);
  *pvVar1 = 0x8f99;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x26);
  *pvVar1 = 0x8239;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x27);
  *pvVar1 = 0x822e;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x28);
  *pvVar1 = 0x8cac;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x29);
  *pvVar1 = 0x822e;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x2a);
  *pvVar1 = 0x8236;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x2b);
  *pvVar1 = 0x8235;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x2c);
  *pvVar1 = 0x88f0;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x2d);
  *pvVar1 = 0x88f0;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x2e);
  *pvVar1 = 0x88f0;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x2f);
  *pvVar1 = 0;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x30);
  *pvVar1 = 0x822b;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x31);
  *pvVar1 = 0x822b;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x32);
  *pvVar1 = 0x8238;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x33);
  *pvVar1 = 0x8f95;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x34);
  *pvVar1 = 0x8237;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x35);
  *pvVar1 = 0x822d;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x36);
  *pvVar1 = 0x822d;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x37);
  *pvVar1 = 0x81a5;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x38);
  *pvVar1 = 0x822a;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x39);
  *pvVar1 = 0x8234;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x3a);
  *pvVar1 = 0x8f98;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x3b);
  *pvVar1 = 0x8233;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x3c);
  *pvVar1 = 0x8229;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x3d);
  *pvVar1 = 0x8229;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x3e);
  *pvVar1 = 0x8232;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x3f);
  *pvVar1 = 0x8f94;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x40);
  *pvVar1 = 0x8231;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x41);
  *pvVar1 = 0x8229;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x42);
  *pvVar1 = 0;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x43);
  *pvVar1 = 0x8c3d;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x44);
  *pvVar1 = 0;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x45);
  *pvVar1 = 0;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x46);
  *pvVar1 = 0x83f0;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x47);
  *pvVar1 = 0x83f0;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x48);
  *pvVar1 = 0x8c4c;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x49);
  *pvVar1 = 0x83f2;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x4a);
  *pvVar1 = 0x83f2;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x4b);
  *pvVar1 = 0x8c4e;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x4c);
  *pvVar1 = 0x83f3;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x4d);
  *pvVar1 = 0x83f3;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x4e);
  *pvVar1 = 0x8c4f;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x4f);
  *pvVar1 = 0x8dbb;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x50);
  *pvVar1 = 0x8dbb;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x51);
  *pvVar1 = 0x8dbc;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x52);
  *pvVar1 = 0x8dbd;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x53);
  *pvVar1 = 0x8dbd;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x54);
  *pvVar1 = 0x8dbe;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x55);
  *pvVar1 = 0;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x56);
  *pvVar1 = 0;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x57);
  *pvVar1 = 0x8058;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x58);
  *pvVar1 = 0;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x59);
  *pvVar1 = 0;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x5a);
  *pvVar1 = 0;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x5b);
  *pvVar1 = 0;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x5c);
  *pvVar1 = 0;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x5d);
  *pvVar1 = 0;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x5e);
  *pvVar1 = 0x8e8f;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x5f);
  *pvVar1 = 0x8e8f;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x60);
  *pvVar1 = 0x8e8e;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x61);
  *pvVar1 = 0x8e8c;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x62);
  *pvVar1 = 0x8e8c;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,99);
  *pvVar1 = 0x8e8d;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,100);
  *pvVar1 = 0x9274;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x65);
  *pvVar1 = 0x9275;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x66);
  *pvVar1 = 0x9276;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x67);
  *pvVar1 = 0x9277;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x68);
  *pvVar1 = 0x9278;
  pvVar1 = std::array<unsigned_int,_106UL>::operator[](&this->m_FmtToGLFmtMap,0x69);
  *pvVar1 = 0x9279;
  return;
}

Assistant:

FormatToGLInternalTexFormatMap()
    {
        // clang-format off
        // http://www.opengl.org/wiki/Image_Format
        m_FmtToGLFmtMap[TEX_FORMAT_UNKNOWN]                = 0;

        m_FmtToGLFmtMap[TEX_FORMAT_RGBA32_TYPELESS]        = GL_RGBA32F;
        m_FmtToGLFmtMap[TEX_FORMAT_RGBA32_FLOAT]           = GL_RGBA32F;
        m_FmtToGLFmtMap[TEX_FORMAT_RGBA32_UINT]            = GL_RGBA32UI;
        m_FmtToGLFmtMap[TEX_FORMAT_RGBA32_SINT]            = GL_RGBA32I;

        m_FmtToGLFmtMap[TEX_FORMAT_RGB32_TYPELESS]         = GL_RGB32F;
        m_FmtToGLFmtMap[TEX_FORMAT_RGB32_FLOAT]            = GL_RGB32F;
        m_FmtToGLFmtMap[TEX_FORMAT_RGB32_UINT]             = GL_RGB32UI;
        m_FmtToGLFmtMap[TEX_FORMAT_RGB32_SINT]             = GL_RGB32I;

        m_FmtToGLFmtMap[TEX_FORMAT_RGBA16_TYPELESS]        = GL_RGBA16F;
        m_FmtToGLFmtMap[TEX_FORMAT_RGBA16_FLOAT]           = GL_RGBA16F;
        m_FmtToGLFmtMap[TEX_FORMAT_RGBA16_UNORM]           = GL_RGBA16;
        m_FmtToGLFmtMap[TEX_FORMAT_RGBA16_UINT]            = GL_RGBA16UI;
        m_FmtToGLFmtMap[TEX_FORMAT_RGBA16_SNORM]           = GL_RGBA16_SNORM;
        m_FmtToGLFmtMap[TEX_FORMAT_RGBA16_SINT]            = GL_RGBA16I;

        m_FmtToGLFmtMap[TEX_FORMAT_RG32_TYPELESS]          = GL_RG32F;
        m_FmtToGLFmtMap[TEX_FORMAT_RG32_FLOAT]             = GL_RG32F;
        m_FmtToGLFmtMap[TEX_FORMAT_RG32_UINT]              = GL_RG32UI;
        m_FmtToGLFmtMap[TEX_FORMAT_RG32_SINT]              = GL_RG32I;

        m_FmtToGLFmtMap[TEX_FORMAT_R32G8X24_TYPELESS]      = GL_DEPTH32F_STENCIL8;
        m_FmtToGLFmtMap[TEX_FORMAT_D32_FLOAT_S8X24_UINT]   = GL_DEPTH32F_STENCIL8;
        m_FmtToGLFmtMap[TEX_FORMAT_R32_FLOAT_X8X24_TYPELESS]=GL_DEPTH32F_STENCIL8;
        m_FmtToGLFmtMap[TEX_FORMAT_X32_TYPELESS_G8X24_UINT]= 0;//GL_DEPTH32F_STENCIL8;

        m_FmtToGLFmtMap[TEX_FORMAT_RGB10A2_TYPELESS]       = GL_RGB10_A2;
        m_FmtToGLFmtMap[TEX_FORMAT_RGB10A2_UNORM]          = GL_RGB10_A2;
        m_FmtToGLFmtMap[TEX_FORMAT_RGB10A2_UINT]           = GL_RGB10_A2UI;
        m_FmtToGLFmtMap[TEX_FORMAT_R11G11B10_FLOAT]        = GL_R11F_G11F_B10F;

        m_FmtToGLFmtMap[TEX_FORMAT_RGBA8_TYPELESS]         = GL_RGBA8;
        m_FmtToGLFmtMap[TEX_FORMAT_RGBA8_UNORM]            = GL_RGBA8;
        m_FmtToGLFmtMap[TEX_FORMAT_RGBA8_UNORM_SRGB]       = GL_SRGB8_ALPHA8;
        m_FmtToGLFmtMap[TEX_FORMAT_RGBA8_UINT]             = GL_RGBA8UI;
        m_FmtToGLFmtMap[TEX_FORMAT_RGBA8_SNORM]            = GL_RGBA8_SNORM;
        m_FmtToGLFmtMap[TEX_FORMAT_RGBA8_SINT]             = GL_RGBA8I;

        m_FmtToGLFmtMap[TEX_FORMAT_RG16_TYPELESS]          = GL_RG16F;
        m_FmtToGLFmtMap[TEX_FORMAT_RG16_FLOAT]             = GL_RG16F;
        m_FmtToGLFmtMap[TEX_FORMAT_RG16_UNORM]             = GL_RG16;
        m_FmtToGLFmtMap[TEX_FORMAT_RG16_UINT]              = GL_RG16UI;
        m_FmtToGLFmtMap[TEX_FORMAT_RG16_SNORM]             = GL_RG16_SNORM;
        m_FmtToGLFmtMap[TEX_FORMAT_RG16_SINT]              = GL_RG16I;

        m_FmtToGLFmtMap[TEX_FORMAT_R32_TYPELESS]           = GL_R32F;
        m_FmtToGLFmtMap[TEX_FORMAT_D32_FLOAT]              = GL_DEPTH_COMPONENT32F;
        m_FmtToGLFmtMap[TEX_FORMAT_R32_FLOAT]              = GL_R32F;
        m_FmtToGLFmtMap[TEX_FORMAT_R32_UINT]               = GL_R32UI;
        m_FmtToGLFmtMap[TEX_FORMAT_R32_SINT]               = GL_R32I;

        m_FmtToGLFmtMap[TEX_FORMAT_R24G8_TYPELESS]         = GL_DEPTH24_STENCIL8;
        m_FmtToGLFmtMap[TEX_FORMAT_D24_UNORM_S8_UINT]      = GL_DEPTH24_STENCIL8;
        m_FmtToGLFmtMap[TEX_FORMAT_R24_UNORM_X8_TYPELESS]  = GL_DEPTH24_STENCIL8;
        m_FmtToGLFmtMap[TEX_FORMAT_X24_TYPELESS_G8_UINT]   = 0;//GL_DEPTH24_STENCIL8;

        m_FmtToGLFmtMap[TEX_FORMAT_RG8_TYPELESS]           = GL_RG8;
        m_FmtToGLFmtMap[TEX_FORMAT_RG8_UNORM]              = GL_RG8;
        m_FmtToGLFmtMap[TEX_FORMAT_RG8_UINT]               = GL_RG8UI;
        m_FmtToGLFmtMap[TEX_FORMAT_RG8_SNORM]              = GL_RG8_SNORM;
        m_FmtToGLFmtMap[TEX_FORMAT_RG8_SINT]               = GL_RG8I;

        m_FmtToGLFmtMap[TEX_FORMAT_R16_TYPELESS]           = GL_R16F;
        m_FmtToGLFmtMap[TEX_FORMAT_R16_FLOAT]              = GL_R16F;
        m_FmtToGLFmtMap[TEX_FORMAT_D16_UNORM]              = GL_DEPTH_COMPONENT16;
        m_FmtToGLFmtMap[TEX_FORMAT_R16_UNORM]              = GL_R16;
        m_FmtToGLFmtMap[TEX_FORMAT_R16_UINT]               = GL_R16UI;
        m_FmtToGLFmtMap[TEX_FORMAT_R16_SNORM]              = GL_R16_SNORM;
        m_FmtToGLFmtMap[TEX_FORMAT_R16_SINT]               = GL_R16I;

        m_FmtToGLFmtMap[TEX_FORMAT_R8_TYPELESS]            = GL_R8;
        m_FmtToGLFmtMap[TEX_FORMAT_R8_UNORM]               = GL_R8;
        m_FmtToGLFmtMap[TEX_FORMAT_R8_UINT]                = GL_R8UI;
        m_FmtToGLFmtMap[TEX_FORMAT_R8_SNORM]               = GL_R8_SNORM;
        m_FmtToGLFmtMap[TEX_FORMAT_R8_SINT]                = GL_R8I;
        // To get the same behaviour as expected for TEX_FORMAT_A8_UNORM we swizzle the components
        // appropriately using the GL_TEXTURE_SWIZZLE texture parameters in TextureBaseGL::SetDefaultGLParameters()
        m_FmtToGLFmtMap[TEX_FORMAT_A8_UNORM]               = GL_R8;

        m_FmtToGLFmtMap[TEX_FORMAT_R1_UNORM]               = 0;

        m_FmtToGLFmtMap[TEX_FORMAT_RGB9E5_SHAREDEXP]       = GL_RGB9_E5;
        m_FmtToGLFmtMap[TEX_FORMAT_RG8_B8G8_UNORM]         = 0;
        m_FmtToGLFmtMap[TEX_FORMAT_G8R8_G8B8_UNORM]        = 0;

        // http://www.g-truc.net/post-0335.html
        // http://renderingpipeline.com/2012/07/texture-compression/
        m_FmtToGLFmtMap[TEX_FORMAT_BC1_TYPELESS]           = GL_COMPRESSED_RGB_S3TC_DXT1_EXT;
        m_FmtToGLFmtMap[TEX_FORMAT_BC1_UNORM]              = GL_COMPRESSED_RGB_S3TC_DXT1_EXT;  // GL_COMPRESSED_RGBA_S3TC_DXT1_EXT;
        m_FmtToGLFmtMap[TEX_FORMAT_BC1_UNORM_SRGB]         = GL_COMPRESSED_SRGB_S3TC_DXT1_EXT; // GL_COMPRESSED_SRGB_ALPHA_S3TC_DXT1_EXT;
        m_FmtToGLFmtMap[TEX_FORMAT_BC2_TYPELESS]           = GL_COMPRESSED_RGBA_S3TC_DXT3_EXT;
        m_FmtToGLFmtMap[TEX_FORMAT_BC2_UNORM]              = GL_COMPRESSED_RGBA_S3TC_DXT3_EXT;
        m_FmtToGLFmtMap[TEX_FORMAT_BC2_UNORM_SRGB]         = GL_COMPRESSED_SRGB_ALPHA_S3TC_DXT3_EXT;
        m_FmtToGLFmtMap[TEX_FORMAT_BC3_TYPELESS]           = GL_COMPRESSED_RGBA_S3TC_DXT5_EXT;
        m_FmtToGLFmtMap[TEX_FORMAT_BC3_UNORM]              = GL_COMPRESSED_RGBA_S3TC_DXT5_EXT;
        m_FmtToGLFmtMap[TEX_FORMAT_BC3_UNORM_SRGB]         = GL_COMPRESSED_SRGB_ALPHA_S3TC_DXT5_EXT;
        m_FmtToGLFmtMap[TEX_FORMAT_BC4_TYPELESS]           = GL_COMPRESSED_RED_RGTC1;
        m_FmtToGLFmtMap[TEX_FORMAT_BC4_UNORM]              = GL_COMPRESSED_RED_RGTC1;
        m_FmtToGLFmtMap[TEX_FORMAT_BC4_SNORM]              = GL_COMPRESSED_SIGNED_RED_RGTC1;
        m_FmtToGLFmtMap[TEX_FORMAT_BC5_TYPELESS]           = GL_COMPRESSED_RG_RGTC2;
        m_FmtToGLFmtMap[TEX_FORMAT_BC5_UNORM]              = GL_COMPRESSED_RG_RGTC2;
        m_FmtToGLFmtMap[TEX_FORMAT_BC5_SNORM]              = GL_COMPRESSED_SIGNED_RG_RGTC2;
        m_FmtToGLFmtMap[TEX_FORMAT_B5G6R5_UNORM]           = 0;
        m_FmtToGLFmtMap[TEX_FORMAT_B5G5R5A1_UNORM]         = 0;
        // To get the same behaviour as expected for TEX_FORMAT_BGRA8_UNORM we swizzle the components
        // appropriately using the GL_TEXTURE_SWIZZLE texture parameters in TextureBaseGL::SetDefaultGLParameters()
        m_FmtToGLFmtMap[TEX_FORMAT_BGRA8_UNORM]            = GL_RGBA8;
        m_FmtToGLFmtMap[TEX_FORMAT_BGRX8_UNORM]            = 0;
        m_FmtToGLFmtMap[TEX_FORMAT_R10G10B10_XR_BIAS_A2_UNORM] = 0;
        m_FmtToGLFmtMap[TEX_FORMAT_BGRA8_TYPELESS]         = 0;
        m_FmtToGLFmtMap[TEX_FORMAT_BGRA8_UNORM_SRGB]       = 0;
        m_FmtToGLFmtMap[TEX_FORMAT_BGRX8_TYPELESS]         = 0;
        m_FmtToGLFmtMap[TEX_FORMAT_BGRX8_UNORM_SRGB]       = 0;
        m_FmtToGLFmtMap[TEX_FORMAT_BC6H_TYPELESS]          = GL_COMPRESSED_RGB_BPTC_UNSIGNED_FLOAT;
        m_FmtToGLFmtMap[TEX_FORMAT_BC6H_UF16]              = GL_COMPRESSED_RGB_BPTC_UNSIGNED_FLOAT;
        m_FmtToGLFmtMap[TEX_FORMAT_BC6H_SF16]              = GL_COMPRESSED_RGB_BPTC_SIGNED_FLOAT;
        m_FmtToGLFmtMap[TEX_FORMAT_BC7_TYPELESS]           = GL_COMPRESSED_RGBA_BPTC_UNORM;
        m_FmtToGLFmtMap[TEX_FORMAT_BC7_UNORM]              = GL_COMPRESSED_RGBA_BPTC_UNORM;
        m_FmtToGLFmtMap[TEX_FORMAT_BC7_UNORM_SRGB]         = GL_COMPRESSED_SRGB_ALPHA_BPTC_UNORM;
        m_FmtToGLFmtMap[TEX_FORMAT_ETC2_RGB8_UNORM]        = GL_COMPRESSED_RGB8_ETC2;
        m_FmtToGLFmtMap[TEX_FORMAT_ETC2_RGB8_UNORM_SRGB]   = GL_COMPRESSED_SRGB8_ETC2;
        m_FmtToGLFmtMap[TEX_FORMAT_ETC2_RGB8A1_UNORM]      = GL_COMPRESSED_RGB8_PUNCHTHROUGH_ALPHA1_ETC2;
        m_FmtToGLFmtMap[TEX_FORMAT_ETC2_RGB8A1_UNORM_SRGB] = GL_COMPRESSED_SRGB8_PUNCHTHROUGH_ALPHA1_ETC2;
        m_FmtToGLFmtMap[TEX_FORMAT_ETC2_RGBA8_UNORM]       = GL_COMPRESSED_RGBA8_ETC2_EAC;
        m_FmtToGLFmtMap[TEX_FORMAT_ETC2_RGBA8_UNORM_SRGB]  = GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC;
        // clang-format on

        static_assert(TEX_FORMAT_NUM_FORMATS == 106, "Please enter the new format information above");
    }